

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void checkArguments(char **argv,size_t *numProducers,size_t *numConsumers,size_t *buffer_capacity,
                   size_t *target)

{
  int *piVar1;
  uintmax_t uVar2;
  ostream *poVar3;
  size_t sVar4;
  uintmax_t *puVar5;
  char *pcVar6;
  byte bVar7;
  long lVar8;
  byte local_49;
  uintmax_t *local_48;
  uintmax_t *local_40;
  uintmax_t *local_38;
  
  pcVar6 = argv[1];
  bVar7 = 1;
  local_40 = numConsumers;
  local_38 = buffer_capacity;
  if (*pcVar6 != '-') {
    lVar8 = 2;
    local_48 = target;
    piVar1 = __errno_location();
    do {
      *piVar1 = 0;
      uVar2 = strtoumax(pcVar6,(char **)0x0,10);
      if ((*piVar1 == 0x22) || (uVar2 == 0)) break;
      puVar5 = numProducers;
      switch((int)lVar8 - 1U & 0xff) {
      case 1:
        break;
      case 2:
        puVar5 = local_40;
        break;
      case 3:
        puVar5 = local_38;
        break;
      case 4:
        *local_48 = uVar2;
        return;
      default:
        goto switchD_0010364a_default;
      }
      *puVar5 = uVar2;
switchD_0010364a_default:
      pcVar6 = argv[lVar8];
      lVar8 = lVar8 + 1;
    } while (*pcVar6 != '-');
    bVar7 = (char)lVar8 - 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"argument ",9);
  local_49 = bVar7;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)&local_49,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (\'",3);
  pcVar6 = argv[bVar7];
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
  }
  else {
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar6,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"\') not valid. Please provide a positive integer no greater than ",0x40);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
  pcVar6 = *argv;
  if (pcVar6 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10a268);
  }
  else {
    sVar4 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             " <# producer threads> <# consumer threads> <buffer size> <# items to produce>",0x4d);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return;
}

Assistant:

void checkArguments(const char *argv[], std::size_t *numProducers, std::size_t *numConsumers, std::size_t *buffer_capacity, std::size_t *target){
    std::size_t argCheck;
    unsigned char i = 1;
    for(; i < 5; ++i){//Ensure all provided arguments are valid
	if(argv[i][0] == '-')
	    break;
	errno = 0;
	argCheck = std::strtoumax(argv[i], NULL, 10);
	if(errno == ERANGE || argCheck == 0)
	    break;
        switch(i){
            case 1:
                *numProducers = argCheck;
                continue;
            case 2:
                *numConsumers = argCheck;
                continue;
            case 3:
		*buffer_capacity = argCheck;
                continue;
            case 4:
		*target = argCheck;
		return;
        }
    }
    std::cerr << "argument " << i << " (\'" << argv[i] << "\') not valid. Please provide a positive integer no greater than " << SIZE_MAX << std::endl;
    std::cerr << "Usage: " << argv[0] << " <# producer threads> <# consumer threads> <buffer size> <# items to produce>" << std::endl;
}